

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::MultiNode<QString,_QCss::StyleRule>::~MultiNode
          (MultiNode<QString,_QCss::StyleRule> *this)

{
  int *piVar1;
  void *in_RSI;
  
  if (*(MultiNodeChain<QCss::StyleRule> **)(this + 0x18) != (MultiNodeChain<QCss::StyleRule> *)0x0)
  {
    MultiNodeChain<QCss::StyleRule>::free(*(MultiNodeChain<QCss::StyleRule> **)(this + 0x18),in_RSI)
    ;
  }
  piVar1 = *(int **)this;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)this,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

~MultiNode()
    {
        if (value)
            value->free();
    }